

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

bool __thiscall
chaiscript::detail::Dispatch_Function::operator==(Dispatch_Function *this,Proxy_Function_Base *rhs)

{
  bool bVar1;
  long lVar2;
  bad_cast *anon_var_0;
  Dispatch_Function *dispatch_fun;
  Proxy_Function_Base *rhs_local;
  Dispatch_Function *this_local;
  
  lVar2 = __dynamic_cast(rhs,&dispatch::Proxy_Function_Base::typeinfo,&typeinfo,0);
  if (lVar2 == 0) {
    __cxa_bad_cast();
  }
  bVar1 = std::operator==(&this->m_funcs,
                          (vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                           *)(lVar2 + 0x28));
  return bVar1;
}

Assistant:

bool operator==(const dispatch::Proxy_Function_Base &rhs) const noexcept override {
        try {
          const auto &dispatch_fun = dynamic_cast<const Dispatch_Function &>(rhs);
          return m_funcs == dispatch_fun.m_funcs;
        } catch (const std::bad_cast &) {
          return false;
        }
      }